

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O2

uint RDL_countURFs(RDL_URFinfo *uInfo)

{
  long lVar1;
  bool bVar2;
  void *__ptr;
  void *pvVar3;
  ulong uVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar4 = (ulong)uInfo->nofWeights;
  __ptr = malloc(uVar4 * 8);
  for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
    pvVar3 = malloc((ulong)uInfo->nofProtos[uVar8]);
    *(void **)((long)__ptr + uVar8 * 8) = pvVar3;
  }
  for (uVar8 = 0; uVar8 < uVar4; uVar8 = uVar8 + 1) {
    for (uVar4 = 0; uVar4 < uInfo->nofProtos[uVar8]; uVar4 = uVar4 + 1) {
      *(undefined1 *)(*(long *)((long)__ptr + uVar8 * 8) + uVar4) = 0;
    }
    uVar4 = (ulong)uInfo->nofWeights;
  }
  uVar6 = 0;
  for (uVar8 = 0; uVar8 < uVar4; uVar8 = uVar8 + 1) {
    puVar5 = uInfo->nofProtos;
    for (uVar4 = 0; uVar4 < puVar5[uVar8]; uVar4 = uVar4 + 1) {
      lVar1 = *(long *)((long)__ptr + uVar8 * 8);
      if ((*(char *)(lVar1 + uVar4) != '\x01') && (uInfo->URFrel[uVar8][uVar4][uVar4] != '\0')) {
        bVar2 = false;
        for (uVar7 = uVar4; uVar7 < puVar5[uVar8]; uVar7 = uVar7 + 1) {
          if (uInfo->URFrel[uVar8][uVar4][uVar7] == '\x01') {
            *(undefined1 *)(lVar1 + uVar7) = 1;
            uVar6 = uVar6 + !bVar2;
            puVar5 = uInfo->nofProtos;
            bVar2 = true;
          }
        }
      }
    }
    uVar4 = (ulong)uInfo->nofWeights;
  }
  for (uVar8 = 0; uVar8 < uVar4; uVar8 = uVar8 + 1) {
    free(*(void **)((long)__ptr + uVar8 * 8));
    uVar4 = (ulong)uInfo->nofWeights;
  }
  free(__ptr);
  return uVar6;
}

Assistant:

unsigned RDL_countURFs(RDL_URFinfo *uInfo)
{
  unsigned URFRelCount=0, weightIdx, i, j;
  char **alreadyInURF; /*for each weight: an array storing if a RCF is already
                        part of a URF*/
  char increase;

  alreadyInURF = malloc(uInfo->nofWeights * sizeof(*alreadyInURF));
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    alreadyInURF[i] = malloc(uInfo->nofProtos[i] * sizeof(*alreadyInURF[i]));
  }
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    for(j=0; j<uInfo->nofProtos[i]; ++j)
    {
      alreadyInURF[i][j] = 0;
    }
  }

  /*count number of 1s indicating URF-relation*/
  for(weightIdx=0; weightIdx<uInfo->nofWeights; ++weightIdx)
  {
    for(i=0; i<uInfo->nofProtos[weightIdx]; ++i)
    {
      if(alreadyInURF[weightIdx][i] == 1 || uInfo->URFrel[weightIdx][i][i] == 0)
      {
        continue;
      }
      increase = 0;
      for(j=i; j<uInfo->nofProtos[weightIdx]; ++j)
      {
        if(uInfo->URFrel[weightIdx][i][j] == 1)
        {
          alreadyInURF[weightIdx][j] = 1;
          if(increase == 0)
          {
            ++URFRelCount;
            increase = 1;
          }
        }
      }
    }
  }

  for(i=0; i<uInfo->nofWeights; ++i)
  {
    free(alreadyInURF[i]);
  }
  free(alreadyInURF);
  return URFRelCount;
}